

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.h
# Opt level: O0

Params * __thiscall
adios2::core::Operator::GetParameters<unsigned_long>(Operator *this,char *buffer,unsigned_long *pos)

{
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  mapped_type *this_00;
  unsigned_long *in_RCX;
  char *in_RDX;
  Operator *in_RSI;
  Params *in_RDI;
  string value;
  string key;
  uint8_t size;
  uint8_t i;
  uint8_t params;
  Params *ret;
  undefined7 in_stack_ffffffffffffff58;
  Params *this_01;
  allocator local_81;
  string local_80 [39];
  allocator local_59;
  string local_58 [34];
  byte local_36;
  byte local_35;
  byte local_22;
  undefined1 local_21;
  unsigned_long *local_20;
  char *local_18;
  
  local_21 = 0;
  this_01 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0xace9ce);
  local_22 = GetParameter<unsigned_char,unsigned_long>(in_RSI,local_18,local_20);
  for (local_35 = 0; local_35 < local_22; local_35 = local_35 + 1) {
    bVar1 = GetParameter<unsigned_char,unsigned_long>(in_RSI,local_18,local_20);
    pcVar2 = local_18 + *local_20;
    uVar3 = (ulong)bVar1;
    local_36 = bVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,pcVar2,uVar3,&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    *local_20 = *local_20 + (ulong)local_36;
    local_36 = GetParameter<unsigned_char,unsigned_long>(in_RSI,local_18,local_20);
    pcVar2 = local_18 + *local_20;
    uVar3 = (ulong)local_36;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,pcVar2,uVar3,&local_81);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    *local_20 = *local_20 + (ulong)local_36;
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_01,(key_type *)CONCAT17(bVar1,in_stack_ffffffffffffff58));
    std::__cxx11::string::operator=((string *)this_00,local_80);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_58);
  }
  return in_RDI;
}

Assistant:

Params GetParameters(const char *buffer, U &pos)
    {
        Params ret;
        uint8_t params = GetParameter<uint8_t>(buffer, pos);
        for (uint8_t i = 0; i < params; ++i)
        {
            uint8_t size = GetParameter<uint8_t>(buffer, pos);
            std::string key = std::string(reinterpret_cast<const char *>(buffer + pos), size);
            pos += size;
            size = GetParameter<uint8_t>(buffer, pos);
            std::string value = std::string(reinterpret_cast<const char *>(buffer + pos), size);
            pos += size;
            ret[key] = value;
        }
        return ret;
    }